

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::~WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this)

{
  string_view fmt;
  debug<> local_11;
  srcLoc local_10;
  
  local_10._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_001994b8;
  fmt._M_str = "WebSocket destructor";
  fmt._M_len = 0x14;
  log::debug<>::debug(&local_11,fmt,&local_10);
  http::std::_Function_base::~_Function_base(&(this->closeHandler).super__Function_base);
  http::std::_Function_base::~_Function_base(&(this->binaryHandler).super__Function_base);
  http::std::_Function_base::~_Function_base(&(this->textHandler).super__Function_base);
  http::std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&(this->decoder).payloadBuffer.
              super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  http::std::experimental::net::v1::
  basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  ::~basic_io_object((basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                      *)this);
  return;
}

Assistant:

~WebSocket() { log::debug("WebSocket destructor"); }